

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O1

PyObject * __thiscall
boost::python::detail::caller_arity<3U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_boost::mpl::vector4<void,__object_*,_HighFreqDataType,_int>_>
             *this,PyObject *args_,PyObject *param_2)

{
  PyTypeObject *pPVar1;
  _object *p_Var2;
  first_type p_Var3;
  HighFreqDataType HVar4;
  PyObject *pPVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  c_t2 c2;
  c_t1 c1;
  undefined8 in_stack_fffffffffffffe88;
  PyTypeObject *pPVar8;
  undefined1 *puVar9;
  undefined8 *in_stack_fffffffffffffea8;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 in_stack_fffffffffffffeb0 [88];
  HighFreqDataType local_b0;
  
  pPVar1 = args_[1].ob_type;
  p_Var2 = (_object *)args_[2].ob_refcnt;
  auVar6 = converter::rvalue_from_python_stage1
                     (p_Var2,converter::detail::registered_base<HighFreqDataType_const_volatile&>::
                             converters);
  puVar9 = auVar6._0_8_;
  if (puVar9 != (undefined1 *)0x0) {
    pPVar8 = args_[2].ob_type;
    auVar7 = converter::rvalue_from_python_stage1
                       ((_object *)pPVar8,
                        converter::detail::registered_base<int_const_volatile&>::converters);
    puVar9 = auVar6._0_8_;
    if (auVar7._0_8_ != 0) {
      p_Var3 = (this->m_data).
               super_compressed_pair_imp<void_(*)(_object_*,_HighFreqDataType,_int),_boost::python::default_call_policies,_2>
               .first_;
      if (auVar6._8_8_ != (code *)0x0) {
        (*auVar6._8_8_)(p_Var2);
      }
      HighFreqDataType::HighFreqDataType(&local_b0,auVar6._0_8_);
      if (auVar7._8_8_ != (code *)0x0) {
        (*auVar7._8_8_)(pPVar8);
      }
      puVar9 = auVar6._0_8_;
      HVar4.name._M_string_length = in_stack_fffffffffffffe88;
      HVar4.super_NetworkDataType._vptr_NetworkDataType = (_func_int **)auVar7._0_8_;
      HVar4.name._M_dataplus._M_p = (pointer)auVar7._8_8_;
      HVar4.name.field_2._M_allocated_capacity = (size_type)pPVar8;
      HVar4.name.field_2._8_8_ = puVar9;
      HVar4.origin._M_dataplus._M_p = (pointer)auVar6._8_8_;
      HVar4.origin._M_string_length = (size_type)in_stack_fffffffffffffea8;
      auVar10 = in_stack_fffffffffffffeb0._16_32_;
      auVar11 = in_stack_fffffffffffffeb0._48_32_;
      HVar4.origin.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )in_stack_fffffffffffffeb0._0_16_;
      HVar4.dataFormat._M_dataplus._M_p = (pointer)auVar10._0_8_;
      HVar4.dataFormat._M_string_length = auVar10._8_8_;
      HVar4.dataFormat.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar10._16_16_;
      HVar4.sockAddr._M_dataplus._M_p = (pointer)auVar11._0_8_;
      HVar4.sockAddr._M_string_length = auVar11._8_8_;
      HVar4.sockAddr.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )auVar11._16_16_;
      HVar4.byteSize = in_stack_fffffffffffffeb0._80_4_;
      HVar4._140_4_ = in_stack_fffffffffffffeb0._84_4_;
      (*p_Var3)((_object *)pPVar1,HVar4,(int)&local_b0);
      HighFreqDataType::~HighFreqDataType(&local_b0);
      pPVar5 = (PyObject *)&_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
      goto LAB_00238511;
    }
  }
  pPVar5 = (PyObject *)0x0;
LAB_00238511:
  if (puVar9 == &stack0xfffffffffffffea8) {
    (*(code *)*in_stack_fffffffffffffea8)();
  }
  return pPVar5;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }